

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  size_t sVar1;
  long lVar2;
  String *pSVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  long lVar7;
  ulong uVar8;
  size_t size;
  void *__src;
  kj *this_00;
  long lVar9;
  char *__dest;
  ArrayPtr<const_kj::String> *__range1;
  Fault f;
  Fault local_58;
  String *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar8 = CONCAT71(in_register_00000011,absolute) & 0xffffffff;
  sVar1 = (this->parts).size_;
  local_50 = __return_storage_ptr__;
  if (sVar1 == 0) {
    this_00 = (kj *)0x3c983a;
    if ((byte)uVar8 != 0) {
      this_00 = (kj *)0x3cbea7;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,this_00,(char (*) [2])CONCAT71(in_register_00000011,absolute))
    ;
  }
  else {
    size = sVar1 - (byte)((byte)uVar8 ^ 1);
    lVar7 = 0;
    do {
      lVar2 = *(long *)((long)&(((this->parts).ptr)->content).size_ + lVar7);
      lVar9 = 0;
      if (lVar2 != 0) {
        lVar9 = lVar2 + -1;
      }
      size = size + lVar9;
      lVar7 = lVar7 + 0x18;
    } while (sVar1 * 0x18 != lVar7);
    heapString(__return_storage_ptr__,size);
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    sVar1 = (this->parts).size_;
    if (sVar1 != 0) {
      pSVar3 = (this->parts).ptr;
      lVar7 = 0;
      do {
        if ((uVar8 & 1) != 0) {
          *__dest = '/';
          __dest = __dest + 1;
        }
        pvVar4 = *(void **)((long)&(pSVar3->content).size_ + lVar7);
        __src = pvVar4;
        if (pvVar4 != (void *)0x0) {
          __src = *(void **)((long)&(pSVar3->content).ptr + lVar7);
        }
        sVar5 = (long)pvVar4 - 1;
        if (pvVar4 == (void *)0x0) {
          sVar5 = 0;
        }
        memcpy(__dest,__src,sVar5);
        lVar2 = *(long *)((long)&(pSVar3->content).size_ + lVar7);
        sVar5 = lVar2 - 1;
        if (lVar2 == 0) {
          sVar5 = 0;
        }
        __dest = __dest + sVar5;
        lVar7 = lVar7 + 0x18;
        uVar8 = 1;
      } while (sVar1 * 0x18 != lVar7);
    }
    sVar1 = (local_50->content).size_;
    pcVar6 = (local_50->content).ptr + (sVar1 - 1);
    if (sVar1 == 0) {
      pcVar6 = (char *)0x0;
    }
    if (__dest != pcVar6) {
      local_58.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      _::Debug::Fault::init
                (&local_58,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                );
      _::Debug::Fault::fatal(&local_58);
    }
  }
  return local_50;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}